

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEdge.c
# Opt level: O0

void Edg_ManToMapping(Gia_Man_t *p)

{
  int iVar1;
  Vec_Wec_t *pVVar2;
  int *piVar3;
  int local_1c;
  int k;
  int iFanin;
  int iObj;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManHasMapping(p);
  if (iVar1 == 0) {
    __assert_fail("Gia_ManHasMapping(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEdge.c"
                  ,0x294,"void Edg_ManToMapping(Gia_Man_t *)");
  }
  Vec_WecFreeP(&p->vMapping2);
  Vec_WecFreeP(&p->vFanouts2);
  iVar1 = Gia_ManObjNum(p);
  pVVar2 = Vec_WecStart(iVar1);
  p->vMapping2 = pVVar2;
  iVar1 = Gia_ManObjNum(p);
  pVVar2 = Vec_WecStart(iVar1);
  p->vFanouts2 = pVVar2;
  k = 1;
  do {
    iVar1 = Gia_ManObjNum(p);
    if (iVar1 <= k) {
      return;
    }
    iVar1 = Gia_ObjIsLut(p,k);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjLutSize(p,k);
      if (4 < iVar1) {
        __assert_fail("Gia_ObjLutSize(p, iObj) <= 4",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEdge.c"
                      ,0x29b,"void Edg_ManToMapping(Gia_Man_t *)");
      }
      for (local_1c = 0; iVar1 = Gia_ObjLutSize(p,k), local_1c < iVar1; local_1c = local_1c + 1) {
        piVar3 = Gia_ObjLutFanins(p,k);
        iVar1 = piVar3[local_1c];
        Vec_WecPush(p->vMapping2,k,iVar1);
        Vec_WecPush(p->vFanouts2,iVar1,k);
      }
    }
    k = k + 1;
  } while( true );
}

Assistant:

void Edg_ManToMapping( Gia_Man_t * p )
{
    int iObj, iFanin, k;
    assert( Gia_ManHasMapping(p) );
    Vec_WecFreeP( &p->vMapping2 );
    Vec_WecFreeP( &p->vFanouts2 );
    p->vMapping2 = Vec_WecStart( Gia_ManObjNum(p) );
    p->vFanouts2 = Vec_WecStart( Gia_ManObjNum(p) );
    Gia_ManForEachLut( p, iObj )
    {
        assert( Gia_ObjLutSize(p, iObj) <= 4 );
        Gia_LutForEachFanin( p, iObj, iFanin, k )
        {
            Vec_WecPush( p->vMapping2, iObj, iFanin );
            Vec_WecPush( p->vFanouts2, iFanin, iObj );
        }
    }
}